

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMan.c
# Opt level: O0

Cnf_Dat_t * Cnf_DataAlloc(Aig_Man_t *pAig,int nVars,int nClauses,int nLiterals)

{
  int iVar1;
  Cnf_Dat_t *__s;
  int **ppiVar2;
  int *piVar3;
  int local_2c;
  int i;
  Cnf_Dat_t *pCnf;
  int nLiterals_local;
  int nClauses_local;
  int nVars_local;
  Aig_Man_t *pAig_local;
  
  __s = (Cnf_Dat_t *)malloc(0x48);
  memset(__s,0,0x48);
  __s->pMan = pAig;
  __s->nVars = nVars;
  __s->nClauses = nClauses;
  __s->nLiterals = nLiterals;
  ppiVar2 = (int **)malloc((long)(nClauses + 1) << 3);
  __s->pClauses = ppiVar2;
  piVar3 = (int *)malloc((long)nLiterals << 2);
  *__s->pClauses = piVar3;
  __s->pClauses[nClauses] = *__s->pClauses + nLiterals;
  iVar1 = Aig_ManObjNumMax(pAig);
  piVar3 = (int *)malloc((long)iVar1 << 2);
  __s->pVarNums = piVar3;
  local_2c = 0;
  while( true ) {
    iVar1 = Aig_ManObjNumMax(pAig);
    if (iVar1 <= local_2c) break;
    __s->pVarNums[local_2c] = -1;
    local_2c = local_2c + 1;
  }
  return __s;
}

Assistant:

Cnf_Dat_t * Cnf_DataAlloc( Aig_Man_t * pAig, int nVars, int nClauses, int nLiterals )
{
    Cnf_Dat_t * pCnf;
    int i;
    pCnf = ABC_ALLOC( Cnf_Dat_t, 1 );
    memset( pCnf, 0, sizeof(Cnf_Dat_t) );
    pCnf->pMan = pAig;
    pCnf->nVars = nVars;
    pCnf->nClauses = nClauses;
    pCnf->nLiterals = nLiterals;
    pCnf->pClauses = ABC_ALLOC( int *, nClauses + 1 );
    pCnf->pClauses[0] = ABC_ALLOC( int, nLiterals );
    pCnf->pClauses[nClauses] = pCnf->pClauses[0] + nLiterals;
    pCnf->pVarNums = ABC_ALLOC( int, Aig_ManObjNumMax(pAig) );
//    memset( pCnf->pVarNums, 0xff, sizeof(int) * Aig_ManObjNumMax(pAig) );
    for ( i = 0; i < Aig_ManObjNumMax(pAig); i++ )
        pCnf->pVarNums[i] = -1;
    return pCnf;
}